

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

Expr * __thiscall kratos::Generator::expr(Generator *this,ExprOp op,Var *left,Var *right)

{
  ExprOp local_48;
  ExprOp op_local;
  Var *left_local;
  Var *right_local;
  shared_ptr<kratos::Expr> expr;
  
  local_48 = op;
  op_local = (ExprOp)left;
  left_local = right;
  std::__shared_ptr<kratos::Expr,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::Expr>,kratos::ExprOp&,kratos::Var*&,kratos::Var*&>
            ((__shared_ptr<kratos::Expr,(__gnu_cxx::_Lock_policy)2> *)&right_local,
             (allocator<kratos::Expr> *)
             ((long)&expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7),&local_48,(Var **)&op_local,&left_local);
  std::
  _Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<std::shared_ptr<kratos::Expr>&>
            ((_Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&this->exprs_,(__shared_ptr<kratos::Expr,(__gnu_cxx::_Lock_policy)2> *)&right_local)
  ;
  if (expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return (Expr *)right_local;
}

Assistant:

Expr &Generator::expr(ExprOp op, Var *left, Var *right) {
    auto expr = std::make_shared<Expr>(op, left, right);
    exprs_.emplace(expr);
    return *expr;
}